

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

bool __thiscall FConsoleCommand::AddToHash(FConsoleCommand *this,FConsoleCommand **table)

{
  char *name;
  size_t namelen;
  FConsoleCommand *pFVar1;
  FConsoleCommand **ppFVar2;
  FConsoleCommand **bucket;
  FConsoleCommand *insert;
  FConsoleCommand **ppFStack_20;
  uint key;
  FConsoleCommand **table_local;
  FConsoleCommand *this_local;
  
  ppFStack_20 = table;
  table_local = (FConsoleCommand **)this;
  insert._4_4_ = MakeKey(this->m_Name);
  ppFVar2 = ppFStack_20 + (ulong)insert._4_4_ % 0xfb;
  pFVar1 = *ppFVar2;
  name = this->m_Name;
  namelen = strlen(this->m_Name);
  pFVar1 = ScanChainForName(pFVar1,name,namelen,(FConsoleCommand **)&bucket);
  if (pFVar1 == (FConsoleCommand *)0x0) {
    if (bucket == (FConsoleCommand **)0x0) {
      this->m_Next = *ppFVar2;
      *ppFVar2 = this;
      this->m_Prev = ppFVar2;
      if (this->m_Next != (FConsoleCommand *)0x0) {
        this->m_Next->m_Prev = &this->m_Next;
      }
    }
    else {
      this->m_Next = bucket[1];
      if (this->m_Next != (FConsoleCommand *)0x0) {
        this->m_Next->m_Prev = &this->m_Next;
      }
      bucket[1] = this;
      this->m_Prev = bucket + 1;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FConsoleCommand::AddToHash (FConsoleCommand **table)
{
	unsigned int key;
	FConsoleCommand *insert, **bucket;

	key = MakeKey (m_Name);
	bucket = &table[key % HASH_SIZE];

	if (ScanChainForName (*bucket, m_Name, strlen (m_Name), &insert))
	{
		return false;
	}
	else
	{
		if (insert)
		{
			m_Next = insert->m_Next;
			if (m_Next)
				m_Next->m_Prev = &m_Next;
			insert->m_Next = this;
			m_Prev = &insert->m_Next;
		}
		else
		{
			m_Next = *bucket;
			*bucket = this;
			m_Prev = bucket;
			if (m_Next)
				m_Next->m_Prev = &m_Next;
		}
	}
	return true;
}